

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readSEND.hpp
# Opt level: O2

void njoy::ENDFtk::section::BaseWithoutMT<njoy::ENDFtk::section::Type<2,152>>::
     readSEND<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *end,long *lineNumber,int MAT,int MF)

{
  long lVar1;
  bool bVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  Tail *pTVar4;
  undefined8 *puVar5;
  char *pcVar6;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  StructureDivision division;
  
  pcVar6 = it->_M_current;
  StructureDivision::StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&division,it,end,lineNumber);
  bVar2 = StructureDivision::isSend(&division);
  if (bVar2) {
    if (division.tail.fields._M_elems[0] == MAT) {
      if (division.tail.fields._M_elems[1] == MF) {
        return;
      }
      tools::Log::error<char_const*>(in_stack_ffffffffffffff68);
      tools::Log::info<char_const*,int>("Expected MF = {}",MF);
      pTVar4 = (Tail *)(division.tail.fields._M_elems + 1);
      pcVar6 = "Encountered MF = {}";
    }
    else {
      tools::Log::error<char_const*>(in_stack_ffffffffffffff68);
      tools::Log::info<char_const*,int>("Expected MAT = {}",MAT);
      pTVar4 = &division.tail;
      pcVar6 = "Encountered MAT = {}";
    }
    tools::Log::info<char_const*,int>(pcVar6,(pTVar4->fields)._M_elems[0]);
  }
  else {
    tools::Log::error<char_const*>(in_stack_ffffffffffffff68);
    lVar1 = *lineNumber;
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (pcVar6,end->_M_current);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_88,pcVar6,_Var3._M_current);
    tools::Log::info<char_const*,long,std::__cxx11::string>
              ("Error parsing line {}: \"{}\"",lVar1 + -1,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = getenv;
  __cxa_throw(puVar5,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void readSEND
( Iterator& it, const Iterator& end, long& lineNumber, int MAT, int MF ) {

  try {

    const auto begin = it;
    auto division = StructureDivision( it, end, lineNumber );
    if ( not division.isSend() ) {

      Log::error( "Malformatted SEND record." );
      Log::info( "Error parsing line {}: \"{}\"",
                 lineNumber - 1,
                 std::string( begin, std::find( begin, end, '\n' ) ) );
      throw std::exception();
    }

    if ( MAT != division.tail.MAT() ) {

      Log::error( "Incorrect Material number (MAT) in SEND record." );
      Log::info( "Expected MAT = {}", MAT );
      Log::info( "Encountered MAT = {}", division.tail.MAT() );
      throw std::exception();
    }

    if ( MF != division.tail.MF() ) {

      Log::error( "Incorrect File number (MF) in SEND record" );
      Log::info( "Expected MF = {}", MF );
      Log::info( "Encountered MF = {}", division.tail.MF() );
      throw std::exception();
    }
  } catch ( std::exception& e ){
    Log::info( "Encountered error while reading the SEND record." );
    throw e;
  }
}